

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O1

void __thiscall QLineEditIconButton::onAnimationFinished(QLineEditIconButton *this)

{
  QLineEditPrivate *this_00;
  
  if (((this->m_hideWithText == true) &&
      ((((this->super_QToolButton).super_QAbstractButton.super_QWidget.data)->widget_attributes &
       0x8000) != 0)) && (this->m_fadingOut == true)) {
    QWidget::hide((QWidget *)this);
    this->m_fadingOut = false;
    this_00 = lineEditPrivate(this);
    if (this_00 != (QLineEditPrivate *)0x0) {
      QWidgetPrivate::updateGeometry_helper(&this_00->super_QWidgetPrivate,true);
      return;
    }
  }
  return;
}

Assistant:

void QLineEditIconButton::onAnimationFinished()
{
    if (shouldHideWithText() && isVisible() && m_fadingOut) {
        hide();
        m_fadingOut = false;

        // Invalidate previous geometry to take into account new size of side widgets
        if (auto le = lineEditPrivate())
            le->updateGeometry_helper(true);
    }
}